

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParameterizedTestSuite<type_param_test::RegisterVerboseSpaceTypeParamTest,_iutest::detail::VariadicTemplateTypeList<type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A,_type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B>,_iutest::detail::VariadicTypeList<int>_>
::
EachTest<int,_iutest::detail::VariadicTemplateTypeList<type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A,_type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B>_>
::EachTest(EachTest<int,_iutest::detail::VariadicTemplateTypeList<type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A,_type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B>_>
           *this,TestSuite *testsuite,string *name)

{
  UnitTest *this_00;
  string *name_local;
  TestSuite *testsuite_local;
  EachTest<int,_iutest::detail::VariadicTemplateTypeList<type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A,_type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B>_>
  *this_local;
  
  iuIObject::iuIObject(&this->super_iuIObject);
  (this->super_iuIObject)._vptr_iuIObject = (_func_int **)&PTR__EachTest_006206a8;
  TestSuiteMediator::TestSuiteMediator(&this->m_mediator,testsuite);
  iuFactory<type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A<int>_>
  ::iuFactory(&this->m_factory);
  TestInfo::TestInfo(&this->m_info,&(this->m_mediator).super_iuITestSuiteMediator,name,
                     &(this->m_factory).super_iuFactoryBase);
  this_00 = UnitTest::instance();
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,testsuite,&this->m_info);
  return;
}

Assistant:

EachTest(TestSuite* testsuite, const ::std::string& name)
            : m_mediator(testsuite)
            , m_info(&m_mediator, name, &m_factory)
        {
            UnitTest::instance().AddTestInfo(testsuite, &m_info);
        }